

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void cpp_db::bind_params(statement *stmt,initializer_list<cpp_db::parameter> params)

{
  parameter *this;
  socklen_t in_ECX;
  sockaddr *__addr;
  parameter *ppVar1;
  long lVar2;
  parameters p;
  parameter param;
  undefined1 auStack_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  ppVar1 = params._M_array;
  (*((stmt->stmt_impl).super___shared_ptr<cpp_db::statement_interface,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_statement_interface[7])();
  statement::get_parameters((statement *)auStack_68);
  if (params._M_len != 0) {
    lVar2 = params._M_len * 0x38;
    this = (parameter *)(auStack_68 + 8);
    do {
      parameter::parameter(this,ppVar1);
      parameters::bind((parameters *)auStack_68,(int)this,__addr,in_ECX);
      if (local_48 != &local_38) {
        operator_delete(local_48,local_38._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_68._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(code *)auStack_68._8_8_)(3,this,0);
        auStack_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      ppVar1 = ppVar1 + 1;
      lVar2 = lVar2 + -0x38;
    } while (lVar2 != 0);
  }
  parameters::~parameters((parameters *)auStack_68);
  return;
}

Assistant:

static void bind_params(statement &stmt, std::initializer_list<parameter> params)
{
	stmt.reset();
	parameters p(stmt.get_parameters());

	for (auto param : params)
		p.bind(param);
}